

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

void __thiscall nv::Kernel2::initSobel(Kernel2 *this)

{
  float *pfVar1;
  long lVar2;
  
  switch(this->m_windowSize) {
  case 3:
    pfVar1 = this->m_data;
    pfVar1[0] = -1.0;
    pfVar1[1] = 0.0;
    pfVar1[2] = 1.0;
    pfVar1[3] = -2.0;
    pfVar1[4] = 0.0;
    pfVar1[5] = 2.0;
    pfVar1[6] = -1.0;
    pfVar1[7] = 0.0;
    pfVar1[8] = 1.0;
    break;
  case 5:
    pfVar1 = this->m_data;
    for (lVar2 = 0; lVar2 != 100; lVar2 = lVar2 + 4) {
      *(undefined4 *)((long)pfVar1 + lVar2) = *(undefined4 *)((long)&DAT_001d7b40 + lVar2);
    }
    break;
  case 7:
    pfVar1 = this->m_data;
    for (lVar2 = 0; lVar2 != 0xc4; lVar2 = lVar2 + 4) {
      *(undefined4 *)((long)pfVar1 + lVar2) = *(undefined4 *)((long)&DAT_001d7a70 + lVar2);
    }
    break;
  case 9:
    pfVar1 = this->m_data;
    for (lVar2 = 0; lVar2 != 0x144; lVar2 = lVar2 + 4) {
      *(undefined4 *)((long)pfVar1 + lVar2) = *(undefined4 *)((long)&DAT_001d7920 + lVar2);
    }
  }
  return;
}

Assistant:

void Kernel2::initSobel()
{
	if (m_windowSize == 3)
	{
		m_data[0] = -1; m_data[1] = 0; m_data[2] = 1;
		m_data[3] = -2; m_data[4] = 0; m_data[5] = 2;
		m_data[6] = -1; m_data[7] = 0; m_data[8] = 1;
	}
	else if (m_windowSize == 5)
	{
		float elements[] = {
            -1, -2, 0, 2, 1,
            -2, -3, 0, 3, 2,
            -3, -4, 0, 4, 3,
            -2, -3, 0, 3, 2,
            -1, -2, 0, 2, 1
		};

		for (int i = 0; i < 5*5; i++) {
			m_data[i] = elements[i];
		}
	}
	else if (m_windowSize == 7)
	{
		float elements[] = {
            -1, -2, -3, 0, 3, 2, 1,
            -2, -3, -4, 0, 4, 3, 2,
            -3, -4, -5, 0, 5, 4, 3,
            -4, -5, -6, 0, 6, 5, 4,
            -3, -4, -5, 0, 5, 4, 3,
            -2, -3, -4, 0, 4, 3, 2,
            -1, -2, -3, 0, 3, 2, 1
		};

		for (int i = 0; i < 7*7; i++) {
			m_data[i] = elements[i];
		}
	}
	else if (m_windowSize == 9)
	{
		float elements[] = {
            -1, -2, -3, -4, 0, 4, 3, 2, 1,
            -2, -3, -4, -5, 0, 5, 4, 3, 2,
            -3, -4, -5, -6, 0, 6, 5, 4, 3,
            -4, -5, -6, -7, 0, 7, 6, 5, 4,
            -5, -6, -7, -8, 0, 8, 7, 6, 5,
            -4, -5, -6, -7, 0, 7, 6, 5, 4,
            -3, -4, -5, -6, 0, 6, 5, 4, 3,
            -2, -3, -4, -5, 0, 5, 4, 3, 2,
            -1, -2, -3, -4, 0, 4, 3, 2, 1
		};
		
		for (int i = 0; i < 9*9; i++) {
			m_data[i] = elements[i];
		}
	}
}